

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::~IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined8 *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  pvVar2 = &this->field_0xb0 + *(long *)(*(long *)this + -0x18);
  *(undefined8 *)((long)pvVar2 + -0xb0) = 0x92e5d8;
  *(undefined8 *)((long)pvVar2 + 0x18) = 0x92e678;
  *(undefined8 *)((long)pvVar2 + -0xa0) = 0x92e600;
  *(undefined8 *)((long)pvVar2 + -0x40) = 0x92e628;
  *(undefined8 *)((long)pvVar2 + -0x30) = 0x92e650;
  if (*(void **)((long)pvVar2 + -0x10) != pvVar2) {
    operator_delete(*(void **)((long)pvVar2 + -0x10));
  }
  *puVar1 = 0x92e7f0;
  puVar1[0x19] = 0x92e840;
  puVar1[2] = 0x92e818;
  if ((undefined8 *)puVar1[9] != puVar1 + 0xb) {
    operator_delete((undefined8 *)puVar1[9]);
  }
  if ((void *)puVar1[6] != (void *)0x0) {
    operator_delete((void *)puVar1[6]);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}